

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateSlice(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Range)

{
  int nSize;
  int iVar1;
  Cba_Man_t *pCVar2;
  int *piVar3;
  uint x;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  int Fill;
  int Fill_00;
  int Fill_01;
  
  if (iFon < 1) {
    __assert_fail("Cba_FonIsReal(iFon)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x596,"int Prs_CreateSlice(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
  }
  pcVar5 = Cba_ManGetSliceName(p,iFon,Range);
  x = Cba_NtkNewStrId(p,pcVar5);
  pCVar2 = p->pDesign;
  nSize = x + 1;
  Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill);
  if ((-1 < (int)x) && ((int)x < (pCVar2->vNameMap).nSize)) {
    iVar1 = (pCVar2->vNameMap).pArray[x];
    if (iVar1 != 0) {
      return iVar1;
    }
    uVar4 = Cba_ObjAlloc(p,CBA_BOX_SLICE,1,1);
    Cba_ObjSetName(p,uVar4,x);
    if ((int)uVar4 < 1) {
      pcVar5 = "i>0";
LAB_003e297d:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
    }
    if ((int)uVar4 < (p->vObjFin0).nSize) {
      iVar1 = (p->vObjFin0).pArray[uVar4];
      lVar6 = (long)iVar1;
      if (lVar6 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if (iVar1 < (p->vFinFon).nSize) {
        piVar3 = (p->vFinFon).pArray;
        if (piVar3[lVar6] != 0) {
          pcVar5 = "Cba_ObjFinFon(p, i, k)== 0";
          goto LAB_003e297d;
        }
        piVar3[lVar6] = iFon;
        if ((int)uVar4 < (p->vObjFon0).nSize) {
          if ((p->vFonRange).nSize < 1) {
            __assert_fail("Cba_NtkHasFonRanges(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
          }
          if (Range < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uVar4 = (p->vObjFon0).pArray[uVar4];
          Vec_IntFillExtra(&p->vFonRange,uVar4 + 1,(int)piVar3);
          if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vFonRange).nSize)) {
            (p->vFonRange).pArray[uVar4] = Range * 2;
            Cba_FonSetName(p,uVar4,x);
            pCVar2 = p->pDesign;
            Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill_00);
            if ((pCVar2->vNameMap).nSize <= (int)x) goto LAB_003e28f1;
            if ((pCVar2->vNameMap).pArray[x] != 0) {
              __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
            }
            Vec_IntFillExtra(&pCVar2->vNameMap,nSize,Fill_01);
            if ((int)x < (pCVar2->vNameMap).nSize) {
              (pCVar2->vNameMap).pArray[x] = uVar4;
              Vec_IntPush(&pCVar2->vUsed,x);
              return uVar4;
            }
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
      }
    }
  }
LAB_003e28f1:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateSlice( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Range )
{
    int iObj, iFonNew, NameId;
    assert( Cba_FonIsReal(iFon) );
    // check existing slice
    NameId = Cba_NtkNewStrId( p, Cba_ManGetSliceName(p, iFon, Range) );
    iFonNew = Cba_NtkGetMap( p, NameId );
    if ( iFonNew )
        return iFonNew;
    // create slice
    iObj = Cba_ObjAlloc( p, CBA_BOX_SLICE, 1, 1 );
    Cba_ObjSetName( p, iObj, NameId );
    Cba_ObjSetFinFon( p, iObj, 0, iFon );
    iFonNew = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFonNew, Range );
    Cba_FonSetName( p, iFonNew, NameId );
    Cba_NtkSetMap( p, NameId, iFonNew );
    return iFonNew;        
}